

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O0

int ply_check_word(p_ply ply)

{
  size_t sVar1;
  size_t size;
  p_ply ply_local;
  
  sVar1 = strlen(ply->buffer + ply->buffer_token);
  if (sVar1 < 0x100) {
    if (sVar1 == 0) {
      ply_ferror(ply,"Unexpected end of file");
      ply_local._4_4_ = 0;
    }
    else {
      ply_local._4_4_ = 1;
    }
  }
  else {
    ply_ferror(ply,"Word too long");
    ply_local._4_4_ = 0;
  }
  return ply_local._4_4_;
}

Assistant:

static int ply_check_word(p_ply ply) {
    size_t size = strlen(BWORD(ply));
    if (size >= WORDSIZE) {
        ply_ferror(ply, "Word too long");
        return 0;
    } else if (size == 0) {
        ply_ferror(ply, "Unexpected end of file");
        return 0;
    }
    return 1;
}